

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_server_main(http_server_t *server,void *data)

{
  uint uVar1;
  http_client_t *phVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  uint uVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  http_client_t *phVar14;
  ulong uVar15;
  fd_set fds;
  char buf [256];
  timeval local_1c8;
  fd_set local_1b8;
  char local_138 [264];
  
  http_server_assert(server);
  local_1c8.tv_sec = 0;
  local_1c8.tv_usec = 0;
  local_1b8.fds_bits[0] = 0;
  local_1b8.fds_bits[1] = 0;
  local_1b8.fds_bits[2] = 0;
  local_1b8.fds_bits[3] = 0;
  local_1b8.fds_bits[4] = 0;
  local_1b8.fds_bits[5] = 0;
  local_1b8.fds_bits[6] = 0;
  local_1b8.fds_bits[7] = 0;
  local_1b8.fds_bits[8] = 0;
  local_1b8.fds_bits[9] = 0;
  local_1b8.fds_bits[10] = 0;
  local_1b8.fds_bits[0xb] = 0;
  local_1b8.fds_bits[0xc] = 0;
  local_1b8.fds_bits[0xd] = 0;
  local_1b8.fds_bits[0xe] = 0;
  local_1b8.fds_bits[0xf] = 0;
  iVar5 = server->fd;
  iVar4 = iVar5 + 0x3f;
  if (-1 < iVar5) {
    iVar4 = iVar5;
  }
  local_1b8.fds_bits[iVar4 >> 6] = local_1b8.fds_bits[iVar4 >> 6] | 1L << ((byte)iVar5 & 0x3f);
  uVar1 = server->num_clients;
  if ((ulong)uVar1 != 0) {
    phVar2 = server->clients;
    lVar10 = 0;
    do {
      iVar5 = *(int *)(phVar2->buf + lVar10 + -0x10);
      if (iVar5 != -1) {
        iVar4 = iVar5 + 0x3f;
        if (-1 < iVar5) {
          iVar4 = iVar5;
        }
        local_1b8.fds_bits[iVar4 >> 6] = local_1b8.fds_bits[iVar4 >> 6] | 1L << ((byte)iVar5 & 0x3f)
        ;
      }
      lVar10 = lVar10 + 0x2018;
    } while ((ulong)uVar1 * 0x2018 - lVar10 != 0);
  }
  iVar4 = select(0x400,&local_1b8,(fd_set *)0x0,(fd_set *)0x0,&local_1c8);
  iVar5 = 0;
  if (-1 < iVar4) {
    uVar1 = server->fd;
    uVar7 = uVar1 + 0x3f;
    if (-1 < (int)uVar1) {
      uVar7 = uVar1;
    }
    if ((((ulong)local_1b8.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) ||
       (iVar4 = http_server_accept(server), iVar5 = 0, iVar4 != 0)) {
      if (server->num_clients != 0) {
        lVar10 = 0x10;
        uVar15 = 0;
        do {
          phVar2 = server->clients;
          uVar1 = phVar2[uVar15].fd;
          if (uVar1 != 0xffffffff) {
            uVar7 = uVar1 + 0x3f;
            if (-1 < (int)uVar1) {
              uVar7 = uVar1;
            }
            if (((ulong)local_1b8.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
              phVar14 = phVar2 + uVar15;
              http_server_assert(server);
              sVar6 = read(phVar14->fd,phVar14->buf + phVar14->len,(long)(0x1ffb - phVar14->len));
              if (0 < (int)sVar6) {
                phVar14->in = phVar14->in + (int)sVar6;
                if (1 < phVar14->found) goto LAB_001044bb;
                time((time_t *)0x0);
                iVar5 = phVar14->found;
                if (iVar5 < 2) {
                  iVar4 = phVar14->len;
                  iVar8 = phVar14->in;
                  if (phVar14->in < iVar4) {
                    iVar8 = iVar4;
                  }
                  lVar11 = 0;
                  do {
                    if ((long)iVar8 - (long)iVar4 == lVar11) break;
                    if (phVar2->buf[lVar11 + iVar4 + lVar10 + -0x10] != '\r') {
                      iVar3 = 0;
                      if (phVar2->buf[lVar11 + iVar4 + lVar10 + -0x10] == '\n') {
                        iVar3 = iVar5 + 1;
                      }
                      iVar5 = iVar3;
                      phVar14->found = iVar5;
                    }
                    phVar14->len = iVar4 + 1 + (int)lVar11;
                    lVar11 = lVar11 + 1;
                  } while (iVar5 < 2);
                }
                if ((long)phVar14->len < 10) {
                  uVar9 = 400;
                  pcVar12 = "Bad Request";
                  pcVar13 = "Not HTTP";
                }
                else {
                  phVar14->buf[phVar14->len] = '\0';
                  iVar5 = strncasecmp(phVar14->buf,"GET /",5);
                  if (iVar5 == 0) {
                    sVar6 = write(phVar14->fd,"HTTP/1.0 200 OK\r\n\r\n",0x13);
                    if (sVar6 != 0x13) goto LAB_001044ad;
                    if ((server->callback == (http_client_callback_t *)0x0) ||
                       (iVar5 = (*server->callback)(phVar14,data), -1 < iVar5)) goto LAB_001044bb;
                    uVar9 = 500;
                    pcVar12 = "Server Internal Error";
                    pcVar13 = "Callback returned error";
                  }
                  else {
                    uVar9 = 400;
                    pcVar12 = "Bad Request";
                    pcVar13 = "Unsupported HTTP Method";
                  }
                }
                iVar5 = snprintf(local_138,0x100,
                                 "HTTP/1.0 %lu %s\r\nConnection: close\r\n\r\n%s\r\n",uVar9,pcVar12,
                                 pcVar13);
                write(phVar14->fd,local_138,(long)iVar5);
              }
LAB_001044ad:
              http_client_close(server,server->clients + uVar15);
            }
          }
LAB_001044bb:
          uVar15 = uVar15 + 1;
          lVar10 = lVar10 + 0x2018;
        } while (uVar15 < server->num_clients);
      }
      http_server_check(server);
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int http_server_main(http_server_t *server, void *data) {
  http_server_assert(server);

  int i;
  
  fd_set fds;
  struct timeval tout;
  
  tout.tv_usec = 0;
  tout.tv_sec = 0;
  
  FD_ZERO(&fds);
  
  /* Select the listening HTTP socket. */
  FD_SET(server->fd, &fds);
  
  /* Select all active client sockets. */
  for (i = 0; i < server->num_clients; i++) {
    if (server->clients[i].fd != -1) {
      FD_SET(server->clients[i].fd, &fds);
    }
  }
  
  if (select(FD_SETSIZE, &fds, NULL, NULL, &tout) < 0) {
    return 0;
  }
  
  /* Accept incoming connections. */
  if (FD_ISSET(server->fd, &fds)) {
    if (!http_server_accept(server))
      return 0;
  }
  
  /* Read incoming client data. */
  for (i = 0; i < server->num_clients; i++) {
    if ((server->clients[i].fd != -1) &&
        (FD_ISSET(server->clients[i].fd, &fds))) {
      if (http_handle_client(server, server->clients + i, data) < 0) {
        http_client_close(server, server->clients + i);
      }
    }
  }
  
  /* Check for client timeouts. */
  http_server_check(server);
  
  return 1;
}